

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-split.cpp
# Opt level: O0

void __thiscall
split_strategy::split_strategy
          (split_strategy *this,split_params *params,ifstream *f_input,gguf_context *ctx_gguf,
          ggml_context *ctx_meta)

{
  bool bVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  reference ppgVar4;
  size_type sVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  split_strategy *in_R8;
  gguf_context **ctx;
  iterator __end1;
  iterator __begin1;
  vector<gguf_context_*,_std::allocator<gguf_context_*>_> *__range1;
  size_t next_tensors_size;
  size_t n_bytes;
  ggml_tensor *t;
  int i;
  size_t curr_tensors_size;
  anon_class_32_4_220f47be new_ctx_out;
  gguf_context *ctx_out;
  int i_split;
  gguf_context *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  value_type *in_stack_ffffffffffffff08;
  anon_class_32_4_220f47be *in_stack_ffffffffffffff10;
  split_params *in_stack_ffffffffffffff18;
  split_strategy *this_00;
  split_params *in_stack_ffffffffffffff20;
  __normal_iterator<gguf_context_**,_std::vector<gguf_context_*,_std::allocator<gguf_context_*>_>_>
  local_98;
  long local_90;
  ulong local_88;
  ulong local_80;
  anon_class_32_4_220f47be *local_78;
  int local_6c;
  ulong local_68;
  undefined4 *local_60;
  undefined8 *local_58;
  undefined8 *local_48;
  undefined8 local_40;
  undefined4 local_38 [4];
  split_strategy *local_28;
  undefined8 local_20;
  undefined8 local_18;
  long local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  split_params::split_params(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  *(undefined8 *)(in_RDI + 0x60) = local_18;
  *(undefined8 *)(in_RDI + 0x68) = local_20;
  *(split_strategy **)(in_RDI + 0x70) = local_28;
  uVar2 = gguf_get_n_tensors(local_20);
  *(undefined4 *)(in_RDI + 0x78) = uVar2;
  std::vector<gguf_context_*,_std::allocator<gguf_context_*>_>::vector
            ((vector<gguf_context_*,_std::allocator<gguf_context_*>_> *)0x108056);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10806c);
  local_38[0] = 0xffffffff;
  local_40 = 0;
  local_60 = local_38;
  local_58 = &local_40;
  local_48 = &local_20;
  split_strategy::anon_class_32_4_220f47be::operator()
            (in_stack_ffffffffffffff10,SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
  if ((*(byte *)(local_10 + 0x58) & 1) != 0) {
    split_strategy::anon_class_32_4_220f47be::operator()
              (in_stack_ffffffffffffff10,SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
  }
  local_68 = 0;
  for (local_6c = 0; local_6c < *(int *)(in_RDI + 0x78); local_6c = local_6c + 1) {
    this_00 = local_28;
    uVar3 = gguf_get_tensor_name(local_20,(long)local_6c);
    in_stack_ffffffffffffff10 = (anon_class_32_4_220f47be *)ggml_get_tensor(this_00,uVar3);
    local_78 = in_stack_ffffffffffffff10;
    in_stack_ffffffffffffff08 = (value_type *)ggml_nbytes(in_stack_ffffffffffffff10);
    local_80 = (long)in_stack_ffffffffffffff08 + 0x1fU & 0xffffffffffffffe0;
    local_88 = local_68 + local_80;
    in_stack_ffffffffffffff07 =
         should_split(this_00,(int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                      (size_t)in_stack_ffffffffffffff08);
    if ((bool)in_stack_ffffffffffffff07) {
      split_strategy::anon_class_32_4_220f47be::operator()
                (in_stack_ffffffffffffff10,SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
      local_68 = local_80;
    }
    else {
      local_68 = local_88;
    }
    gguf_add_tensor(local_40,local_78);
  }
  std::vector<gguf_context_*,_std::allocator<gguf_context_*>_>::push_back
            ((vector<gguf_context_*,_std::allocator<gguf_context_*>_> *)in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08);
  local_90 = in_RDI + 0x80;
  local_98._M_current =
       (gguf_context **)
       std::vector<gguf_context_*,_std::allocator<gguf_context_*>_>::begin
                 ((vector<gguf_context_*,_std::allocator<gguf_context_*>_> *)
                  in_stack_fffffffffffffef8);
  std::vector<gguf_context_*,_std::allocator<gguf_context_*>_>::end
            ((vector<gguf_context_*,_std::allocator<gguf_context_*>_> *)in_stack_fffffffffffffef8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<gguf_context_**,_std::vector<gguf_context_*,_std::allocator<gguf_context_*>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                       (__normal_iterator<gguf_context_**,_std::vector<gguf_context_*,_std::allocator<gguf_context_*>_>_>
                        *)in_stack_fffffffffffffef8);
    if (!bVar1) break;
    ppgVar4 = __gnu_cxx::
              __normal_iterator<gguf_context_**,_std::vector<gguf_context_*,_std::allocator<gguf_context_*>_>_>
              ::operator*(&local_98);
    in_stack_fffffffffffffef8 = *ppgVar4;
    sVar5 = std::vector<gguf_context_*,_std::allocator<gguf_context_*>_>::size
                      ((vector<gguf_context_*,_std::allocator<gguf_context_*>_> *)(in_RDI + 0x80));
    gguf_set_val_u16(in_stack_fffffffffffffef8,"split.count",sVar5 & 0xffff);
    __gnu_cxx::
    __normal_iterator<gguf_context_**,_std::vector<gguf_context_*,_std::allocator<gguf_context_*>_>_>
    ::operator++(&local_98);
  }
  return;
}

Assistant:

split_strategy(const split_params & params,
            std::ifstream & f_input,
            struct gguf_context * ctx_gguf,
            struct ggml_context * ctx_meta) :
        params(params),
        f_input(f_input),
        ctx_gguf(ctx_gguf),
        ctx_meta(ctx_meta),
        n_tensors(gguf_get_n_tensors(ctx_gguf)) {

        // because we need to know list of tensors for each file in advance, we will build all the ctx_out for all output splits
        int i_split = -1;
        struct gguf_context * ctx_out = NULL;
        auto new_ctx_out = [&](bool allow_no_tensors) {
            i_split++;
            if (ctx_out != NULL) {
                if (gguf_get_n_tensors(ctx_out) == 0 && !allow_no_tensors) {
                    fprintf(stderr, "error: one of splits have 0 tensors. Maybe size or tensors limit is too small\n");
                    exit(EXIT_FAILURE);
                }
                ctx_outs.push_back(ctx_out);
            }
            ctx_out = gguf_init_empty();
            // Save all metadata in first split only
            if (i_split == 0) {
                gguf_set_kv(ctx_out, ctx_gguf);
            }
            gguf_set_val_u16(ctx_out, LLM_KV_SPLIT_NO, i_split);
            gguf_set_val_u16(ctx_out, LLM_KV_SPLIT_COUNT, 0); // placeholder
            gguf_set_val_i32(ctx_out, LLM_KV_SPLIT_TENSORS_COUNT, n_tensors);
        };

        // initialize ctx_out for the first split
        new_ctx_out(false);

        // skip first split if no_tensor_first_split is set
        if (params.no_tensor_first_split) {
            new_ctx_out(true);
        }

        // process tensors one by one
        size_t curr_tensors_size = 0; // current size by counting only tensors size (without metadata)
        for (int i = 0; i < n_tensors; ++i) {
            struct ggml_tensor * t = ggml_get_tensor(ctx_meta, gguf_get_tensor_name(ctx_gguf, i));
            // calculate the "imaginary" size = the current size + next tensor size
            size_t n_bytes = GGML_PAD(ggml_nbytes(t), GGUF_DEFAULT_ALIGNMENT);
            size_t next_tensors_size = curr_tensors_size + n_bytes;
            if (should_split(i, next_tensors_size)) {
                new_ctx_out(false);
                curr_tensors_size = n_bytes;
            } else {
                curr_tensors_size = next_tensors_size;
            }
            gguf_add_tensor(ctx_out, t);
        }

        // push the last ctx_out
        ctx_outs.push_back(ctx_out);

        // set the correct n_split for all ctx_out
        for (auto & ctx : ctx_outs) {
            gguf_set_val_u16(ctx, LLM_KV_SPLIT_COUNT, ctx_outs.size());
        }
    }